

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpcComms.cpp
# Opt level: O0

void __thiscall helics::ipc::IpcComms::queue_rx_function(IpcComms *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  action_t aVar5;
  SmallBuffer *this_00;
  ActionMessage *pAVar6;
  long in_RDI;
  interprocess_exception *ipe;
  optional<helics::ActionMessage> cmdopt;
  ActionMessage err_1;
  __int_type_conflict1 bc;
  bool IPCoperating;
  ActionMessage err;
  bool connected;
  OwnedQueue rxQueue;
  memory_order __b;
  undefined7 in_stack_fffffffffffffc18;
  undefined1 in_stack_fffffffffffffc1f;
  undefined4 in_stack_fffffffffffffc20;
  __int_type_conflict1 in_stack_fffffffffffffc24;
  undefined4 in_stack_fffffffffffffc28;
  ConnectionStatus in_stack_fffffffffffffc2c;
  CommsInterface *in_stack_fffffffffffffc30;
  undefined8 in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc44;
  SmallBuffer *in_stack_fffffffffffffc48;
  undefined7 in_stack_fffffffffffffc60;
  byte in_stack_fffffffffffffc67;
  queue_state_t qVar7;
  OwnedQueue *this_01;
  int in_stack_fffffffffffffd44;
  OwnedQueue *in_stack_fffffffffffffd48;
  ConnectionStatus local_1a4;
  byte local_d1;
  OwnedQueue local_d0;
  int local_14;
  memory_order local_10;
  int local_c;
  SmallBuffer *local_8;
  
  this_01 = &local_d0;
  OwnedQueue::OwnedQueue
            ((OwnedQueue *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
  iVar3 = OwnedQueue::connect(this_01,(int)in_RDI + 0xf0,
                              (sockaddr *)(ulong)*(uint *)(in_RDI + 0x26c),
                              *(socklen_t *)(in_RDI + 0x268));
  local_1a4 = in_stack_fffffffffffffc2c;
  local_d1 = (byte)iVar3;
  do {
    local_d1 = local_d1 & 1;
    if (((local_d1 ^ 0xff) & 1) == 0) {
      CommsInterface::setRxStatus(in_stack_fffffffffffffc30,local_1a4);
      bVar1 = false;
      goto LAB_004a7cd8;
    }
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)
               CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60));
    uVar4 = OwnedQueue::connect(&local_d0,(int)in_RDI + 0xf0,
                                (sockaddr *)(ulong)*(uint *)(in_RDI + 0x26c),
                                *(socklen_t *)(in_RDI + 0x268));
    aVar5 = (action_t)((ulong)in_stack_fffffffffffffc38 >> 0x20);
    in_stack_fffffffffffffc67 = (byte)uVar4;
    local_d1 = in_stack_fffffffffffffc67;
  } while ((uVar4 & 1) != 0);
  std::atomic<bool>::operator=
            ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
             (bool)in_stack_fffffffffffffc1f);
  qVar7 = (queue_state_t)((ulong)in_RDI >> 0x20);
  ActionMessage::ActionMessage
            ((ActionMessage *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),aVar5);
  OwnedQueue::getError_abi_cxx11_(&local_d0);
  SmallBuffer::operator=
            (in_stack_fffffffffffffc48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40));
  std::function<void_(helics::ActionMessage_&&)>::operator()
            ((function<void_(helics::ActionMessage_&&)> *)
             CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
             (ActionMessage *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
  CommsInterface::setRxStatus(in_stack_fffffffffffffc30,local_1a4);
  OwnedQueue::changeState(this_01,qVar7);
  ActionMessage::~ActionMessage
            ((ActionMessage *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
  goto LAB_004a81e1;
LAB_004a7cd8:
  do {
    this_00 = (SmallBuffer *)(in_RDI + 0x410);
    local_c = 5;
    local_8 = this_00;
    local_10 = std::operator&(seq_cst,__memory_order_mask);
    if (local_c - 1U < 2) {
      local_14 = *(int *)(this_00->buffer)._M_elems;
    }
    else if (local_c == 5) {
      local_14 = *(int *)(this_00->buffer)._M_elems;
    }
    else {
      local_14 = *(int *)(this_00->buffer)._M_elems;
    }
    if (local_14 == 2) {
      iVar3 = local_14;
      uVar4 = OwnedQueue::connect(&local_d0,(int)in_RDI + 0xf0,
                                  (sockaddr *)(ulong)*(uint *)(in_RDI + 0x26c),
                                  *(socklen_t *)(in_RDI + 0x268));
      aVar5 = (action_t)((ulong)in_stack_fffffffffffffc38 >> 0x20);
      in_stack_fffffffffffffc40 = CONCAT13((char)uVar4,(int3)in_stack_fffffffffffffc40);
      if ((uVar4 & 1) == 0) {
        std::atomic<bool>::operator=
                  ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                   (bool)in_stack_fffffffffffffc1f);
        qVar7 = (queue_state_t)((ulong)in_RDI >> 0x20);
        ActionMessage::ActionMessage
                  ((ActionMessage *)CONCAT44(iVar3,in_stack_fffffffffffffc40),aVar5);
        OwnedQueue::getError_abi_cxx11_(&local_d0);
        SmallBuffer::operator=
                  (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(iVar3,in_stack_fffffffffffffc40));
        std::function<void_(helics::ActionMessage_&&)>::operator()
                  ((function<void_(helics::ActionMessage_&&)> *)
                   CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                   (ActionMessage *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
        CommsInterface::setRxStatus(in_stack_fffffffffffffc30,local_1a4);
        OwnedQueue::changeState(this_01,qVar7);
        std::__atomic_base<int>::operator=
                  ((__atomic_base<int> *)CONCAT44(local_1a4,in_stack_fffffffffffffc28),
                   in_stack_fffffffffffffc24);
        ActionMessage::~ActionMessage
                  ((ActionMessage *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
        goto LAB_004a81e1;
      }
      std::__atomic_base<int>::operator=
                ((__atomic_base<int> *)CONCAT44(local_1a4,in_stack_fffffffffffffc28),
                 in_stack_fffffffffffffc24);
    }
    else if (local_14 == 4) {
      std::__atomic_base<int>::operator=
                ((__atomic_base<int> *)CONCAT44(local_1a4,in_stack_fffffffffffffc28),
                 in_stack_fffffffffffffc24);
      break;
    }
    OwnedQueue::getMessage(in_stack_fffffffffffffd48,in_stack_fffffffffffffd44);
    bVar2 = std::optional::operator_cast_to_bool((optional<helics::ActionMessage> *)0x4a7f2d);
    if (bVar2) {
      std::optional<helics::ActionMessage>::operator*((optional<helics::ActionMessage> *)0x4a7f4e);
      bVar2 = isProtocolCommand((ActionMessage *)
                                CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
      if (bVar2) {
        pAVar6 = std::optional<helics::ActionMessage>::operator->
                           ((optional<helics::ActionMessage> *)0x4a7f6c);
        if (pAVar6->messageID == 0x16570bf) {
          std::atomic<bool>::operator=
                    ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                     (bool)in_stack_fffffffffffffc1f);
          local_1a4 = ERRORED|RECONNECTING;
        }
        else {
          pAVar6 = std::optional<helics::ActionMessage>::operator->
                             ((optional<helics::ActionMessage> *)0x4a7fa8);
          if ((pAVar6->messageID == 0x20fc7) && (!bVar1)) {
            OwnedQueue::changeState(this_01,(queue_state_t)((ulong)in_RDI >> 0x20));
            bVar1 = true;
          }
          local_1a4 = ERRORED;
        }
      }
      else {
        pAVar6 = std::optional<helics::ActionMessage>::operator->
                           ((optional<helics::ActionMessage> *)0x4a801b);
        aVar5 = ActionMessage::action(pAVar6);
        if ((aVar5 == cmd_init_grant) && (!bVar1)) {
          OwnedQueue::changeState(this_01,(queue_state_t)((ulong)in_RDI >> 0x20));
          bVar1 = true;
        }
        in_stack_fffffffffffffc30 = (CommsInterface *)(in_RDI + 0x278);
        std::optional<helics::ActionMessage>::operator*((optional<helics::ActionMessage> *)0x4a806d)
        ;
        std::function<void_(helics::ActionMessage_&&)>::operator()
                  ((function<void_(helics::ActionMessage_&&)> *)
                   CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                   (ActionMessage *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
        local_1a4 = CONNECTED;
      }
    }
    else {
      local_1a4 = ERRORED;
    }
    std::optional<helics::ActionMessage>::~optional((optional<helics::ActionMessage> *)0x4a8094);
  } while ((local_1a4 == CONNECTED) || (local_1a4 == ERRORED));
  OwnedQueue::changeState(this_01,(queue_state_t)((ulong)in_RDI >> 0x20));
  CommsInterface::setRxStatus(in_stack_fffffffffffffc30,local_1a4);
LAB_004a81e1:
  OwnedQueue::~OwnedQueue
            ((OwnedQueue *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
  return;
}

Assistant:

void IpcComms::queue_rx_function()
    {
        OwnedQueue rxQueue;
        bool connected = rxQueue.connect(localTargetAddress, maxMessageCount, maxMessageSize);
        while (!connected) {
            std::this_thread::sleep_for(connectionTimeout);
            connected = rxQueue.connect(localTargetAddress, maxMessageCount, maxMessageSize);
            if (!connected) {
                disconnecting = true;
                ActionMessage err(CMD_ERROR);
                err.messageID = defs::Errors::CONNECTION_FAILURE;
                err.payload = rxQueue.getError();
                ActionCallback(std::move(err));
                setRxStatus(ConnectionStatus::ERRORED);  // the connection has failed
                rxQueue.changeState(queue_state_t::closing);
                return;
            }
        }
        setRxStatus(
            ConnectionStatus::CONNECTED);  // this is a atomic indicator that the rx queue is ready
        bool IPCoperating = false;
        while (true) {
            auto bc = ipcbackchannel.load();

            switch (bc) {
                case IPC_BACKCHANNEL_DISCONNECT:
                    ipcbackchannel = 0;
                    goto DISCONNECT_RX_QUEUE;
                case IPC_BACKCHANNEL_TRY_RESET:
                    connected =
                        rxQueue.connect(localTargetAddress, maxMessageCount, maxMessageSize);
                    if (!connected) {
                        disconnecting = true;
                        ActionMessage err(CMD_ERROR);
                        err.messageID = defs::Errors::CONNECTION_FAILURE;
                        err.payload = rxQueue.getError();
                        ActionCallback(std::move(err));
                        setRxStatus(ConnectionStatus::ERRORED);  // the connection has failed
                        rxQueue.changeState(queue_state_t::closing);
                        ipcbackchannel = 0;
                        return;
                    }
                    ipcbackchannel = 0;
                    break;
                default:
                    break;
            }
            auto cmdopt = rxQueue.getMessage(2000);
            if (!cmdopt) {
                continue;
            }
            if (isProtocolCommand(*cmdopt)) {
                if (cmdopt->messageID == CLOSE_RECEIVER) {
                    disconnecting = true;
                    break;
                }
                if (cmdopt->messageID == SET_TO_OPERATING) {
                    if (!IPCoperating) {
                        rxQueue.changeState(queue_state_t::operating);
                        IPCoperating = true;
                    }
                }
                continue;
            }
            if (cmdopt->action() == CMD_INIT_GRANT) {
                if (!IPCoperating) {
                    rxQueue.changeState(queue_state_t::operating);
                    IPCoperating = true;
                }
            }
            ActionCallback(std::move(*cmdopt));
        }
    DISCONNECT_RX_QUEUE:
        try {
            rxQueue.changeState(queue_state_t::closing);
        }
        catch (boost::interprocess::interprocess_exception const& ipe) {
            logError(std::string("error changing states:") + ipe.what());
        }
        setRxStatus(ConnectionStatus::TERMINATED);
    }